

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O2

String * __thiscall Bstrlib::String::operator+=(String *this,uint c)

{
  String local_20;
  
  Print((char *)&local_20,"%u",c);
  operator+=(this,&local_20);
  ~String(&local_20);
  return this;
}

Assistant:

const String& String::operator +=(const unsigned int c)
    {
#ifndef HasFloatParsing
        char buffer[11] = { 0 };
        utoa((unsigned long)c, buffer, 10);
        return *this += buffer;
#else
        return *this += String::Print("%u", c);
#endif
    }